

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::
Dynamic_Caster<chaiscript::dispatch::Proxy_Function_Base,_chaiscript::dispatch::Assignable_Proxy_Function>
::cast(Dynamic_Caster<chaiscript::dispatch::Proxy_Function_Base,_chaiscript::dispatch::Assignable_Proxy_Function>
       *this,Boxed_Value *t_from)

{
  uint uVar1;
  element_type *peVar2;
  type_info *ptVar3;
  type_info *ptVar4;
  bool bVar5;
  void *pvVar6;
  reference_wrapper<chaiscript::dispatch::Assignable_Proxy_Function> obj;
  element_type *peVar7;
  reference_wrapper<const_chaiscript::dispatch::Assignable_Proxy_Function> obj_00;
  undefined8 *puVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar11;
  Boxed_Value BVar12;
  Type_Info local_48;
  shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function> local_30;
  
  local_48.m_type_info = (type_info *)&dispatch::Proxy_Function_Base::typeinfo;
  local_48.m_bare_type_info = (type_info *)&dispatch::Proxy_Function_Base::typeinfo;
  local_48._16_8_ = local_48._16_8_ & 0xffffffff00000000;
  bVar5 = Type_Info::bare_equal
                    (&((t_from->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,&local_48);
  if (!bVar5) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x38);
    peVar2 = (t_from->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.m_flags = (peVar2->m_type_info).m_flags;
    local_48._20_4_ = *(undefined4 *)&(peVar2->m_type_info).field_0x14;
    ptVar3 = (peVar2->m_type_info).m_type_info;
    ptVar4 = (peVar2->m_type_info).m_bare_type_info;
    *puVar8 = &PTR__bad_cast_003c8d98;
    local_48.m_type_info._0_4_ = SUB84(ptVar3,0);
    local_48.m_type_info._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
    local_48.m_bare_type_info._0_4_ = SUB84(ptVar4,0);
    local_48.m_bare_type_info._4_4_ = (undefined4)((ulong)ptVar4 >> 0x20);
    *(undefined4 *)(puVar8 + 1) = local_48.m_type_info._0_4_;
    *(undefined4 *)((long)puVar8 + 0xc) = local_48.m_type_info._4_4_;
    *(undefined4 *)(puVar8 + 2) = local_48.m_bare_type_info._0_4_;
    *(undefined4 *)((long)puVar8 + 0x14) = local_48.m_bare_type_info._4_4_;
    puVar8[3] = local_48._16_8_;
    puVar8[4] = &dispatch::Assignable_Proxy_Function::typeinfo;
    puVar8[5] = 0x1f;
    puVar8[6] = "Unknown dynamic_cast_conversion";
    *puVar8 = &PTR__bad_cast_003c8dd8;
    local_48.m_type_info = ptVar3;
    local_48.m_bare_type_info = ptVar4;
    __cxa_throw(puVar8,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                std::bad_cast::~bad_cast);
  }
  peVar2 = (t_from->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (peVar2->m_type_info).m_flags;
  if (peVar2->m_is_ref == false) {
    peVar7 = (element_type *)0x0;
    if ((uVar1 & 1) == 0) {
      Cast_Helper_Inner<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>::cast
                ((Boxed_Value *)&local_48,(Type_Conversions_State *)t_from);
      if (local_48.m_type_info != (type_info *)0x0) {
        peVar7 = (element_type *)
                 __dynamic_cast(local_48.m_type_info,&dispatch::Proxy_Function_Base::typeinfo,
                                &dispatch::Assignable_Proxy_Function::typeinfo,0);
      }
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info;
      if (peVar7 == (element_type *)0x0) {
        peVar7 = (element_type *)0x0;
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_48.m_type_info = (type_info *)0x0;
        local_48.m_bare_type_info = (type_info *)0x0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info);
      }
      if (peVar7 == (element_type *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = std::_Rb_tree_rebalance_for_erase;
        __cxa_throw(puVar8,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_30.
      super___shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar7;
      local_30.
      super___shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var10;
      sVar11 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Assignable_Proxy_Function>
                         ((Object_Data *)this,&local_30,false);
      _Var9 = sVar11.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      Cast_Helper_Inner<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::cast
                ((Boxed_Value *)&local_48,(Type_Conversions_State *)t_from);
      if (local_48.m_type_info != (type_info *)0x0) {
        peVar7 = (element_type *)
                 __dynamic_cast(local_48.m_type_info,&dispatch::Proxy_Function_Base::typeinfo,
                                &dispatch::Assignable_Proxy_Function::typeinfo,0);
      }
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info;
      if (peVar7 == (element_type *)0x0) {
        peVar7 = (element_type *)0x0;
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_48.m_type_info = (type_info *)0x0;
        local_48.m_bare_type_info = (type_info *)0x0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info);
      }
      if (peVar7 == (element_type *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = std::_Rb_tree_rebalance_for_erase;
        __cxa_throw(puVar8,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_30.
      super___shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar7;
      local_30.
      super___shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var10;
      sVar11 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Assignable_Proxy_Function_const>
                         ((Object_Data *)this,
                          (shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> *)
                          &local_30,false);
      _Var9 = sVar11.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    if (local_30.
        super___shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.
                 super___shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      _Var9._M_pi = extraout_RDX;
    }
  }
  else if ((uVar1 & 1) == 0) {
    pvVar6 = verify_type<void>(t_from,(type_info *)&dispatch::Proxy_Function_Base::typeinfo,
                               peVar2->m_data_ptr);
    obj._M_data = (Assignable_Proxy_Function *)
                  __dynamic_cast(pvVar6,&dispatch::Proxy_Function_Base::typeinfo,
                                 &dispatch::Assignable_Proxy_Function::typeinfo,0);
    if (obj._M_data == (Assignable_Proxy_Function *)0x0) {
LAB_002ecfba:
      __cxa_bad_cast();
    }
    sVar11 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Assignable_Proxy_Function>
                       ((Object_Data *)this,obj,false);
    _Var9 = sVar11.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    pvVar6 = verify_type<void>(t_from,(type_info *)&dispatch::Proxy_Function_Base::typeinfo,
                               peVar2->m_const_data_ptr);
    obj_00._M_data =
         (Assignable_Proxy_Function *)
         __dynamic_cast(pvVar6,&dispatch::Proxy_Function_Base::typeinfo,
                        &dispatch::Assignable_Proxy_Function::typeinfo,0);
    if (obj_00._M_data == (Assignable_Proxy_Function *)0x0) goto LAB_002ecfba;
    sVar11 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Assignable_Proxy_Function_const>
                       ((Object_Data *)this,obj_00,false);
    _Var9 = sVar11.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from) {
        if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>())) {
          if (t_from.is_pointer()) {
            // Dynamic cast out the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              return Boxed_Value([&]() {
                if (auto data
                    = std::dynamic_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
                  throw std::bad_cast();
                }
              }());
            } else {
              return Boxed_Value([&]() {
                if (auto data = std::dynamic_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
#ifdef CHAISCRIPT_LIBCPP
                  /// \todo fix this someday after libc++ is fixed.
                  if (std::string(typeid(To).name()).find("Assignable_Proxy_Function") != std::string::npos) {
                    auto from = detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr);
                    if (std::string(typeid(*from).name()).find("Assignable_Proxy_Function_Impl") != std::string::npos) {
                      return std::static_pointer_cast<To>(from);
                    }
                  }
#endif
                  throw std::bad_cast();
                }
              }());
            }
          } else {
            // Pull the reference out of the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
              const To &data = dynamic_cast<const To &>(d);
              return Boxed_Value(std::cref(data));
            } else {
              From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
              To &data = dynamic_cast<To &>(d);
              return Boxed_Value(std::ref(data));
            }
          }
        } else {
          throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
        }
      }